

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

char ** __thiscall
icu_63::LocalMemory<const_char_*>::allocateInsteadAndReset
          (LocalMemory<const_char_*> *this,int32_t newCapacity)

{
  char **__s;
  
  if (0 < newCapacity) {
    __s = (char **)uprv_malloc_63((ulong)(uint)newCapacity << 3);
    if (__s != (char **)0x0) {
      memset(__s,0,(ulong)(uint)newCapacity << 3);
      uprv_free_63((this->super_LocalPointerBase<const_char_*>).ptr);
      (this->super_LocalPointerBase<const_char_*>).ptr = __s;
      return __s;
    }
  }
  return (char **)0x0;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndReset(int32_t newCapacity) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            uprv_memset(p, 0, newCapacity*sizeof(T));
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}